

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O0

String * capnp::compiler::anon_unknown_0::doLex<capnp::compiler::LexedTokens>
                   (String *__return_storage_ptr__,StringPtr constText)

{
  Builder result_00;
  bool bVar1;
  char *pcVar2;
  size_t in_RCX;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params;
  Builder *extraout_RDX_01;
  ArrayPtr<const_char> input;
  StringPtr value;
  char *c_1;
  char *__end3_1;
  char *__begin3_1;
  String *__range3_1;
  bool _kj_shouldLog;
  ErrorReporter local_198;
  TestFailingErrorReporter errorReporter;
  Builder file;
  MallocMessageBuilder message;
  char *c;
  char *__end3;
  char *local_58;
  char *__begin3;
  String *__range3;
  undefined1 local_38 [8];
  String text;
  StringPtr constText_local;
  String *result;
  
  value.content.ptr = (char *)constText.content.size_;
  text.content.disposer = (ArrayDisposer *)constText.content.ptr;
  value.content.size_ = in_RCX;
  kj::heapString((String *)local_38,(kj *)text.content.disposer,value);
  local_58 = kj::String::begin((String *)local_38);
  pcVar2 = kj::String::end((String *)local_38);
  for (; local_58 != pcVar2; local_58 = local_58 + 1) {
    if (*local_58 == '\'') {
      *local_58 = '\"';
    }
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&file._builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            ((Builder *)&errorReporter,(MessageBuilder *)&file._builder.dataSize);
  TestFailingErrorReporter::TestFailingErrorReporter((TestFailingErrorReporter *)&local_198);
  input = kj::String::operator_cast_to_ArrayPtr((String *)local_38);
  result_00._builder.capTable = (CapTableBuilder *)file._builder.segment;
  result_00._builder.segment =
       (SegmentBuilder *)errorReporter.super_ErrorReporter._vptr_ErrorReporter;
  result_00._builder.data = file._builder.capTable;
  result_00._builder.pointers = (WirePointer *)file._builder.data;
  result_00._builder._32_8_ = file._builder.pointers;
  bVar1 = lex(input,result_00,&local_198);
  params = extraout_RDX;
  if (!bVar1) {
    __range3_1._7_1_ = kj::_::Debug::shouldLog(ERROR);
    params = extraout_RDX_00;
    while (__range3_1._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[48]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x3d,ERROR,"\"failed: expected \" \"lex(text, file, errorReporter)\"",
                 (char (*) [48])"failed: expected lex(text, file, errorReporter)");
      params = extraout_RDX_01;
      __range3_1._7_1_ = false;
    }
  }
  kj::str<capnp::compiler::LexedTokens::Builder&>
            (__return_storage_ptr__,(kj *)&errorReporter,params);
  __end3_1 = kj::String::begin(__return_storage_ptr__);
  pcVar2 = kj::String::end(__return_storage_ptr__);
  for (; __end3_1 != pcVar2; __end3_1 = __end3_1 + 1) {
    if (*__end3_1 == '\"') {
      *__end3_1 = '\'';
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&file._builder.dataSize);
  kj::String::~String((String *)local_38);
  return __return_storage_ptr__;
}

Assistant:

kj::String doLex(kj::StringPtr constText) {
  // Parse the given string into the given Cap'n Proto struct type using lex(), then stringify the
  // result and return that string.  Additionally, single quotes in the input are converted to
  // double quotes, and double quotes in the output are converted to single quotes, to reduce the
  // amount of escaping needed in the test strings.
  //
  // Comparing stringifications against golden strings is ugly and brittle.  If we had a
  // text-format parser we could use that.  Except that said parser would probably be built on
  // the very lexer being tested here, so...  maybe this is the best we can reasonably do.

  kj::String text = heapString(constText);
  for (char& c: text) {
    // Make it easier to write input strings below.
    if (c == '\'') c = '\"';
  }
  MallocMessageBuilder message;
  auto file = message.initRoot<LexResult>();
  TestFailingErrorReporter errorReporter;
  EXPECT_TRUE(lex(text, file, errorReporter));
  kj::String result = kj::str(file);
  for (char& c: result) {
    // Make it easier to write golden strings below.
    if (c == '\"') c = '\'';
  }
  return result;
}